

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::LengthOfComputeResultTest::prepareShaderSource
          (LengthOfComputeResultTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  pointer psVar1;
  TestError *this_00;
  char *pcVar2;
  char *pcVar3;
  size_t position;
  size_t local_38;
  
  if (in_stage < SHADER_STAGES_MAX) {
    pcVar2 = (&PTR_anon_var_dwarf_5cb7cf_02122de0)[in_stage];
    psVar1 = (out_source->m_parts).
             super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (char *)(psVar1->m_code)._M_string_length;
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar3,(ulong)pcVar2);
    local_38 = 0;
    pcVar2 = "#version 420";
    if (in_use_version_400) {
      pcVar2 = 
      "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
      ;
    }
    pcVar3 = "#version 430";
    if (in_stage != COMPUTE_SHADER) {
      pcVar3 = pcVar2;
    }
    Utils::replaceToken("VERSION",&local_38,pcVar3,
                        &((out_source->m_parts).
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceToken("UNIFORMS",&local_38,
                        "uniform mat2x4 goten;\nuniform uvec4  indices;\nuniform uvec4  expected_lengths;\nuniform mat4x3 gohan;\nuniform vec3   vegeta;\nuniform vec3   trunks;\nuniform uint   variable;\nuniform float  expected_sum;\n"
                        ,&((out_source->m_parts).
                           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceToken("VERIFICATION",&local_38,
                        "    uint lengths[4];\n    float x[(gohan * goten).length()];\n    float y[(gohan * goten)[variable - 1].length()];\n\n    lengths[indices.x] = gohan[variable].length();\n    lengths[indices.y] = (gohan * goten).length();\n    lengths[indices.z] = (gohan * goten)[variable].length();\n    lengths[indices.w] = (vegeta * trunks).length();\n\n    float  dot_result = dot(vegeta, trunks);\n    mat2x3 mul_result = gohan * goten;\n\n#ifdef TESS_CTRL\n    const uint position_length        = gl_out[gl_InvocationID].gl_Position.length();\n#endif\n#ifndef COMPUTE\n#ifndef FRAGMENT\n#ifndef TESS_CTRL\n    const uint position_length        = gl_Position.length();\n#endif  /*TESS_CTRL */\n#endif /* FRAGMENT */\n#endif /* COMPUTE */\n#ifdef FRAGMENT\n    const uint point_coord_length     = gl_PointCoord.length();\n    const uint sample_position_length = gl_SamplePosition.length();\n#endif /* FRAGMENT */\n    const uint outer_length           = outerProduct(vegeta, trunks).length();\n\n    for (uint i = 0; i < x.length(); ++i)\n    {\n        x[i] = mul_result[i].x;\n    }\n\n    for (uint i = 0; i < y.length(); ++i)\n    {\n        y[i] = mul_result[0][i];\n    }\n\n    if ( (expected_lengths.x != lengths[0])                   ||\n         (expected_lengths.y != lengths[1])                   ||\n         (expected_lengths.z != lengths[2])                   ||\n         (expected_lengths.w != lengths[3])                   ||\n#ifndef COMPUTE\n#ifndef FRAGMENT\n         (4 /* vec4 */       != position_length)              ||\n#endif /* FRAGMENT */\n#endif /* COMPUTE */\n#ifdef FRAGMENT\n         (2 /* vec2 */       != point_coord_length)           ||\n         (2 /* vec2 */       != sample_position_length)       ||\n#endif /* FRAGMENT */\n         (0.5                != dot_result)                   ||\n         (3 /* mat3 */       != outer_length)                 ||\n         (expected_sum       != x[variable] + y[variable])    )\n    {\n        result = vec4(1, 0, 0, 1);\n    }\n"
                        ,&((out_source->m_parts).
                           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_code);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x4003);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void LengthOfComputeResultTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
													Utils::shaderSource& out_source)
{
	static const GLchar* uniforms = "uniform mat2x4 goten;\n"
									"uniform uvec4  indices;\n"
									"uniform uvec4  expected_lengths;\n"
									"uniform mat4x3 gohan;\n"
									"uniform vec3   vegeta;\n"
									"uniform vec3   trunks;\n"
									"uniform uint   variable;\n"
									"uniform float  expected_sum;\n";

	static const GLchar* verification_snippet =
		"    uint lengths[4];\n"
		"    float x[(gohan * goten).length()];\n"
		"    float y[(gohan * goten)[variable - 1].length()];\n"
		"\n"
		"    lengths[indices.x] = gohan[variable].length();\n"
		"    lengths[indices.y] = (gohan * goten).length();\n"
		"    lengths[indices.z] = (gohan * goten)[variable].length();\n"
		"    lengths[indices.w] = (vegeta * trunks).length();\n"
		"\n"
		"    float  dot_result = dot(vegeta, trunks);\n"
		"    mat2x3 mul_result = gohan * goten;\n"
		"\n"
		"#ifdef TESS_CTRL\n"
		"    const uint position_length        = gl_out[gl_InvocationID].gl_Position.length();\n"
		"#endif\n"
		"#ifndef COMPUTE\n"
		"#ifndef FRAGMENT\n"
		"#ifndef TESS_CTRL\n"
		"    const uint position_length        = gl_Position.length();\n"
		"#endif  /*TESS_CTRL */\n"
		"#endif /* FRAGMENT */\n"
		"#endif /* COMPUTE */\n"
		"#ifdef FRAGMENT\n"
		"    const uint point_coord_length     = gl_PointCoord.length();\n"
		"    const uint sample_position_length = gl_SamplePosition.length();\n"
		"#endif /* FRAGMENT */\n"
		"    const uint outer_length           = outerProduct(vegeta, trunks).length();\n"
		"\n"
		"    for (uint i = 0; i < x.length(); ++i)\n"
		"    {\n"
		"        x[i] = mul_result[i].x;\n"
		"    }\n"
		"\n"
		"    for (uint i = 0; i < y.length(); ++i)\n"
		"    {\n"
		"        y[i] = mul_result[0][i];\n"
		"    }\n"
		"\n"
		"    if ( (expected_lengths.x != lengths[0])                   ||\n"
		"         (expected_lengths.y != lengths[1])                   ||\n"
		"         (expected_lengths.z != lengths[2])                   ||\n"
		"         (expected_lengths.w != lengths[3])                   ||\n"
		"#ifndef COMPUTE\n"
		"#ifndef FRAGMENT\n"
		"         (4 /* vec4 */       != position_length)              ||\n"
		"#endif /* FRAGMENT */\n"
		"#endif /* COMPUTE */\n"
		"#ifdef FRAGMENT\n"
		"         (2 /* vec2 */       != point_coord_length)           ||\n"
		"         (2 /* vec2 */       != sample_position_length)       ||\n"
		"#endif /* FRAGMENT */\n"
		"         (0.5                != dot_result)                   ||\n"
		"         (3 /* mat3 */       != outer_length)                 ||\n"
		"         (expected_sum       != x[variable] + y[variable])    )\n"
		"    {\n"
		"        result = vec4(1, 0, 0, 1);\n"
		"    }\n";

	static const GLchar* compute_shader_template =
		"VERSION\n"
		"\n"
		"#define COMPUTE\n"
		"\n"
		"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"writeonly uniform image2D uni_image;\n"
		"\n"
		"UNIFORMS"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"\n"
		"    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), result);\n"
		"}\n"
		"\n";

	static const GLchar* fragment_shader_template = "VERSION\n"
													"\n"
													"#define FRAGMENT\n"
													"\n"
													"in  vec4 gs_fs_result;\n"
													"out vec4 fs_out_result;\n"
													"\n"
													"UNIFORMS"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    fs_out_result = result;\n"
													"}\n"
													"\n";

	static const GLchar* geometry_shader_template = "VERSION\n"
													"\n"
													"layout(points)                           in;\n"
													"layout(triangle_strip, max_vertices = 4) out;\n"
													"\n"
													"in  vec4 tes_gs_result[];\n"
													"out vec4 gs_fs_result;\n"
													"\n"
													"UNIFORMS"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(-1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(-1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result  = result;\n"
													"    gl_Position   = vec4(1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"}\n"
													"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"#define TESS_CTRL\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in  vec4 vs_tcs_result[];\n"
		"out vec4 tcs_tes_result[];\n"
		"\n"
		"UNIFORMS"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template = "VERSION\n"
													 "\n"
													 "layout(isolines, point_mode) in;\n"
													 "\n"
													 "in  vec4 tcs_tes_result[];\n"
													 "out vec4 tes_gs_result;\n"
													 "\n"
													 "UNIFORMS"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    vec4 result = vec4(0, 1, 0, 1);\n"
													 "\n"
													 "VERIFICATION"
													 "    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n"
													 "    {\n"
													 "         result = vec4(1, 0, 0, 1);\n"
													 "    }\n"
													 "\n"
													 "    tes_gs_result = result;\n"
													 "}\n"
													 "\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "\n"
												  "out vec4 vs_tcs_result;\n"
												  "\n"
												  "UNIFORMS"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = vec4(0, 1, 0, 1);\n"
												  "\n"
												  "VERIFICATION"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "}\n"
												  "\n";

	const GLchar* shader_template = 0;

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		shader_template = compute_shader_template;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;
	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceToken("UNIFORMS", position, uniforms, out_source.m_parts[0].m_code);

	Utils::replaceToken("VERIFICATION", position, verification_snippet, out_source.m_parts[0].m_code);
}